

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O0

CURLcode xfer_send(Curl_easy *data,char *buf,size_t blen,size_t hds_len,size_t *pnwritten)

{
  _Bool eos_00;
  _Bool _Var1;
  CURLcode CVar2;
  size_t sVar3;
  size_t local_60;
  size_t body_len;
  size_t body_bytes;
  _Bool eos;
  CURLcode result;
  size_t *pnwritten_local;
  size_t hds_len_local;
  size_t blen_local;
  char *buf_local;
  Curl_easy *data_local;
  
  eos_00 = false;
  *pnwritten = 0;
  hds_len_local = blen;
  if (((data->set).max_send_speed != 0) && ((data->set).max_send_speed < (long)(blen - hds_len))) {
    hds_len_local = hds_len + (data->set).max_send_speed;
  }
  if (((*(uint *)&(data->req).field_0xd1 >> 5 & 1) != 0) &&
     ((_Var1 = Curl_bufq_is_empty(&(data->req).sendbuf), _Var1 ||
      (sVar3 = Curl_bufq_len(&(data->req).sendbuf), sVar3 == hds_len_local)))) {
    eos_00 = true;
  }
  CVar2 = Curl_xfer_send(data,buf,hds_len_local,eos_00,pnwritten);
  if (CVar2 == CURLE_OK) {
    if ((eos_00 != false) && (hds_len_local == *pnwritten)) {
      *(uint *)&(data->req).field_0xd1 = *(uint *)&(data->req).field_0xd1 & 0xffffffbf | 0x40;
    }
    if (*pnwritten != 0) {
      if (hds_len != 0) {
        local_60 = hds_len;
        if (*pnwritten <= hds_len) {
          local_60 = *pnwritten;
        }
        Curl_debug(data,CURLINFO_HEADER_OUT,buf,local_60);
      }
      if (hds_len < *pnwritten) {
        sVar3 = *pnwritten;
        Curl_debug(data,CURLINFO_DATA_OUT,buf + hds_len,sVar3 - hds_len);
        (data->req).writebytecount = (sVar3 - hds_len) + (data->req).writebytecount;
        Curl_pgrsSetUploadCounter(data,(data->req).writebytecount);
      }
    }
  }
  return CVar2;
}

Assistant:

static CURLcode xfer_send(struct Curl_easy *data,
                          const char *buf, size_t blen,
                          size_t hds_len, size_t *pnwritten)
{
  CURLcode result = CURLE_OK;
  bool eos = FALSE;

  *pnwritten = 0;
  DEBUGASSERT(hds_len <= blen);
#ifdef DEBUGBUILD
  {
    /* Allow debug builds to override this logic to force short initial
       sends */
    size_t body_len = blen - hds_len;
    if(body_len) {
      const char *p = getenv("CURL_SMALLREQSEND");
      if(p) {
        curl_off_t body_small;
        if(!Curl_str_number(&p, &body_small, body_len))
          blen = hds_len + (size_t)body_small;
      }
    }
  }
#endif
  /* Make sure this does not send more body bytes than what the max send
     speed says. The headers do not count to the max speed. */
  if(data->set.max_send_speed) {
    size_t body_bytes = blen - hds_len;
    if((curl_off_t)body_bytes > data->set.max_send_speed)
      blen = hds_len + (size_t)data->set.max_send_speed;
  }

  if(data->req.eos_read &&
    (Curl_bufq_is_empty(&data->req.sendbuf) ||
     Curl_bufq_len(&data->req.sendbuf) == blen)) {
    DEBUGF(infof(data, "sending last upload chunk of %zu bytes", blen));
    eos = TRUE;
  }
  result = Curl_xfer_send(data, buf, blen, eos, pnwritten);
  if(!result) {
    if(eos && (blen == *pnwritten))
      data->req.eos_sent = TRUE;
    if(*pnwritten) {
      if(hds_len)
        Curl_debug(data, CURLINFO_HEADER_OUT, buf,
                   CURLMIN(hds_len, *pnwritten));
      if(*pnwritten > hds_len) {
        size_t body_len = *pnwritten - hds_len;
        Curl_debug(data, CURLINFO_DATA_OUT, buf + hds_len, body_len);
        data->req.writebytecount += body_len;
        Curl_pgrsSetUploadCounter(data, data->req.writebytecount);
      }
    }
  }
  return result;
}